

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O2

void __thiscall duckdb::WALWriteState::WriteUpdate(WALWriteState *this,UpdateInfo *info)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  uint uVar1;
  UpdateSegment *this_01;
  idx_t iVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  WriteAheadLog *this_02;
  DataTableInfo *table_info;
  pointer pDVar5;
  Allocator *allocator;
  reference pvVar6;
  sel_t *psVar7;
  ColumnData *this_03;
  type chunk;
  idx_t i;
  ulong uVar8;
  UndoFlags new_op;
  idx_t i_1;
  vector<duckdb::LogicalType,_true> update_types;
  vector<unsigned_long,_true> column_indexes;
  SelectionVector sel;
  
  this_03 = info->segment->column_data;
  table_info = ColumnData::GetTableInfo(this_03);
  SwitchTable(this,table_info,new_op);
  update_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  update_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  update_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this_03->type).id_ == VALIDITY) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&update_types,
               &LogicalType::BOOLEAN);
  }
  else {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&update_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
               ,&this_03->type);
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&update_types,
             &LogicalType::ROW_TYPE);
  make_uniq<duckdb::DataChunk>();
  psVar7 = sel.sel_vector;
  this_00 = &this->update_chunk;
  sel.sel_vector = (sel_t *)0x0;
  ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
            ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)this_00,
             (pointer)psVar7);
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&sel);
  pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(pDVar5,allocator,&update_types,0x800);
  this_01 = info->segment;
  iVar2 = info->vector_index;
  pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar6 = vector<duckdb::Vector,_true>::get<true>(&pDVar5->data,0);
  UpdateSegment::FetchCommitted(this_01,iVar2,pvVar6);
  pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar6 = vector<duckdb::Vector,_true>::get<true>(&pDVar5->data,1);
  pdVar3 = pvVar6->data;
  iVar2 = info->vector_index;
  iVar4 = this_03->start;
  psVar7 = UpdateInfo::GetTuples(info);
  uVar1 = info->N;
  for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    *(ulong *)(pdVar3 + (ulong)psVar7[uVar8] * 8) = (ulong)psVar7[uVar8] + iVar2 * 0x800 + iVar4;
  }
  if ((this_03->type).id_ == VALIDITY) {
    pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&pDVar5->data,0);
    pdVar3 = pvVar6->data;
    uVar1 = info->N;
    for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
      pdVar3[psVar7[uVar8]] = '\0';
    }
  }
  SelectionVector::SelectionVector(&sel,psVar7);
  pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  DataChunk::Slice(pDVar5,&sel,(ulong)info->N);
  column_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (; (this_03->parent).ptr != (ColumnData *)0x0;
      this_03 = optional_ptr<duckdb::ColumnData,_true>::operator*(&this_03->parent)) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_indexes,
               &this_03->column_index);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_indexes,
             &info->column_index);
  ::std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (column_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             column_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this_02 = this->log;
  chunk = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    (this_00);
  WriteAheadLog::WriteUpdate(this_02,chunk,&column_indexes);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_indexes);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&update_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

void WALWriteState::WriteUpdate(UpdateInfo &info) {
	// switch to the current table, if necessary
	auto &column_data = info.segment->column_data;
	auto &table_info = column_data.GetTableInfo();

	SwitchTable(&table_info, UndoFlags::UPDATE_TUPLE);

	// initialize the update chunk
	vector<LogicalType> update_types;
	if (column_data.type.id() == LogicalTypeId::VALIDITY) {
		update_types.emplace_back(LogicalType::BOOLEAN);
	} else {
		update_types.push_back(column_data.type);
	}
	update_types.emplace_back(LogicalType::ROW_TYPE);

	update_chunk = make_uniq<DataChunk>();
	update_chunk->Initialize(Allocator::DefaultAllocator(), update_types);

	// fetch the updated values from the base segment
	info.segment->FetchCommitted(info.vector_index, update_chunk->data[0]);

	// write the row ids into the chunk
	auto row_ids = FlatVector::GetData<row_t>(update_chunk->data[1]);
	idx_t start = column_data.start + info.vector_index * STANDARD_VECTOR_SIZE;
	auto tuples = info.GetTuples();
	for (idx_t i = 0; i < info.N; i++) {
		row_ids[tuples[i]] = UnsafeNumericCast<int64_t>(start + tuples[i]);
	}
	if (column_data.type.id() == LogicalTypeId::VALIDITY) {
		// zero-initialize the booleans
		// FIXME: this is only required because of NullValue<T> in Vector::Serialize...
		auto booleans = FlatVector::GetData<bool>(update_chunk->data[0]);
		for (idx_t i = 0; i < info.N; i++) {
			auto idx = tuples[i];
			booleans[idx] = false;
		}
	}
	SelectionVector sel(tuples);
	update_chunk->Slice(sel, info.N);

	// construct the column index path
	vector<column_t> column_indexes;
	reference<const ColumnData> current_column_data = column_data;
	while (current_column_data.get().HasParent()) {
		column_indexes.push_back(current_column_data.get().column_index);
		current_column_data = current_column_data.get().Parent();
	}
	column_indexes.push_back(info.column_index);
	std::reverse(column_indexes.begin(), column_indexes.end());

	log.WriteUpdate(*update_chunk, column_indexes);
}